

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  char cVar1;
  ImGuiWindow *pIVar2;
  ImDrawList *draw_list;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiCol idx;
  bool bVar5;
  ImU32 IVar6;
  uint uVar7;
  ulong uVar8;
  ImGuiTableColumn *pIVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [64];
  ImVec2 local_78;
  float local_6c;
  ImRect outer_border;
  
  pIVar2 = table->InnerWindow;
  bVar5 = ImRect::Overlaps(&table->OuterWindow->ClipRect,&table->OuterRect);
  if (!bVar5) {
    return;
  }
  draw_list = pIVar2->DrawList;
  ImDrawListSplitter::SetCurrentChannel(table->DrawSplitter,draw_list,0);
  ImDrawList::PushClipRect
            (draw_list,(table->Bg0ClipRectForDrawCmd).Min,(table->Bg0ClipRectForDrawCmd).Max,false);
  fVar14 = (table->InnerRect).Min.y;
  fVar11 = (table->InnerRect).Max.y;
  auVar15 = ZEXT464((uint)fVar11);
  auVar13 = ZEXT416((uint)fVar11);
  fVar11 = fVar14;
  if (table->IsUsingHeaders == true) {
    if (table->FreezeRowsCount < '\x01') {
      fVar11 = (table->WorkRect).Min.y;
    }
    auVar12 = vminss_avx(auVar13,ZEXT416((uint)(fVar11 + table->LastFirstRowHeight)));
    fVar11 = auVar12._0_4_;
  }
  uVar7 = table->Flags;
  if ((uVar7 >> 9 & 1) != 0) {
    uVar8 = 0;
    local_6c = fVar14;
    while ((long)uVar8 < (long)table->ColumnsCount) {
      if ((table->EnabledMaskByDisplayOrder >> (uVar8 & 0x3f) & 1) == 0) {
        uVar8 = uVar8 + 1;
      }
      else {
        cVar1 = (table->DisplayOrderToIndex).Data[uVar8];
        if (table->ResizedColumn == cVar1) {
          bVar5 = table->InstanceInteracted == table->InstanceCurrent;
        }
        else {
          bVar5 = false;
        }
        pIVar9 = (table->Columns).Data + cVar1;
        uVar8 = uVar8 + 1;
        if ((bool)(pIVar9->MaxX <= (table->InnerClipRect).Max.x | bVar5)) {
          if ((((pIVar9->NextEnabledColumn != -1) || ((pIVar9->Flags & 0x40000020U) == 0)) ||
              ((table->Flags & 0x1e000U) == 0x4000)) && ((pIVar9->ClipRect).Min.x < pIVar9->MaxX)) {
            if ((table->HoveredColumnBorder == cVar1 || bVar5) ||
               (uVar8 == (uint)(int)table->FreezeColumnsCount)) {
              if (bVar5) {
                idx = 0x1d;
LAB_0027b1f0:
                IVar6 = GetColorU32(idx,1.0);
                auVar15 = ZEXT1664(auVar13);
                fVar14 = local_6c;
              }
              else {
                if (table->HoveredColumnBorder == cVar1) {
                  idx = 0x1c;
                  goto LAB_0027b1f0;
                }
                IVar6 = table->BorderColorStrong;
              }
              fVar10 = auVar15._0_4_;
            }
            else {
              bVar5 = (table->Flags & 0x1800) == 0;
              IVar6 = table->RowBgColor[(ulong)bVar5 + 2];
              fVar10 = (float)((uint)bVar5 * auVar15._0_4_ + (uint)!bVar5 * (int)fVar11);
            }
            if (fVar14 < fVar10) {
              outer_border.Min.x = pIVar9->MaxX;
              local_78.y = fVar10;
              local_78.x = outer_border.Min.x;
              outer_border.Min.y = fVar14;
              ImDrawList::AddLine(draw_list,&outer_border.Min,&local_78,IVar6,1.0);
              auVar15 = ZEXT1664(auVar13);
              fVar14 = local_6c;
            }
          }
        }
      }
    }
    uVar7 = table->Flags;
  }
  if ((uVar7 & 0x500) == 0) goto LAB_0027b386;
  IVar3 = (table->OuterRect).Min;
  IVar4 = (table->OuterRect).Max;
  outer_border.Min.x = IVar3.x;
  outer_border.Min.y = IVar3.y;
  outer_border.Max.x = IVar4.x;
  outer_border.Max.y = IVar4.y;
  IVar6 = table->BorderColorStrong;
  if ((uVar7 & 0x500) == 0x500) {
    ImDrawList::AddRect(draw_list,&outer_border.Min,&outer_border.Max,IVar6,0.0,0,1.0);
  }
  else {
    if ((uVar7 >> 10 & 1) == 0) {
      if ((uVar7 >> 8 & 1) == 0) goto LAB_0027b383;
      auVar12._4_4_ = outer_border.Max.x;
      auVar12._0_4_ = outer_border.Min.y;
      auVar12._8_8_ = 0;
      auVar13 = vshufps_avx(auVar12,auVar12,0xe1);
      local_78 = (ImVec2)vmovlps_avx(auVar13);
      ImDrawList::AddLine(draw_list,&outer_border.Min,&local_78,IVar6,1.0);
      local_78.y = outer_border.Max.y;
      local_78.x = outer_border.Min.x;
    }
    else {
      local_78.y = outer_border.Max.y;
      local_78.x = outer_border.Min.x;
      ImDrawList::AddLine(draw_list,&outer_border.Min,&local_78,IVar6,1.0);
      auVar13._4_4_ = outer_border.Max.x;
      auVar13._0_4_ = outer_border.Min.y;
      auVar13._8_8_ = 0;
      auVar13 = vshufps_avx(auVar13,auVar13,0xe1);
      local_78 = (ImVec2)vmovlps_avx(auVar13);
    }
    ImDrawList::AddLine(draw_list,&local_78,&outer_border.Max,IVar6,1.0);
  }
LAB_0027b383:
  uVar7 = table->Flags;
LAB_0027b386:
  if ((((char)uVar7 < '\0') && (fVar14 = table->RowPosY2, fVar14 < (table->OuterRect).Max.y)) &&
     (((table->BgClipRect).Min.y <= fVar14 && (fVar14 < (table->BgClipRect).Max.y)))) {
    outer_border.Min.x = table->BorderX1;
    local_78.y = fVar14;
    local_78.x = table->BorderX2;
    outer_border.Min.y = fVar14;
    ImDrawList::AddLine(draw_list,&outer_border.Min,&local_78,table->BorderColorLight,1.0);
  }
  ImDrawList::PopClipRect(draw_list);
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter->SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, 0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}